

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O0

int coda_cursor_get_array_dim(coda_cursor *cursor,int *num_dims,long *dim)

{
  coda_backend cVar1;
  char *pcVar2;
  coda_type *local_38;
  coda_type *type;
  long *dim_local;
  int *num_dims_local;
  coda_cursor *cursor_local;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x890);
    cursor_local._4_4_ = -1;
  }
  else if ((num_dims == (int *)0x0) || (dim == (long *)0x0)) {
    coda_set_error(-100,"dimension argument(s) are NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x895);
    cursor_local._4_4_ = -1;
  }
  else {
    if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
      local_38 = (coda_type *)cursor->stack[cursor->n + -1].type;
    }
    else {
      local_38 = (cursor->stack[cursor->n + -1].type)->definition;
    }
    if (local_38->type_class == 1) {
      cVar1 = (cursor->stack[cursor->n + -1].type)->backend;
      if (cVar1 < 2) {
        cursor_local._4_4_ = coda_ascbin_cursor_get_array_dim(cursor,num_dims,dim);
      }
      else if (cVar1 == coda_backend_memory) {
        cursor_local._4_4_ = coda_mem_cursor_get_array_dim(cursor,num_dims,dim);
      }
      else if (cVar1 == coda_backend_hdf4) {
        coda_set_error(-0xb,(char *)0x0);
        cursor_local._4_4_ = -1;
      }
      else if (cVar1 == coda_backend_hdf5) {
        coda_set_error(-0xd,(char *)0x0);
        cursor_local._4_4_ = -1;
      }
      else if (cVar1 == coda_backend_cdf) {
        cursor_local._4_4_ = coda_cdf_cursor_get_array_dim(cursor,num_dims,dim);
      }
      else if (cVar1 == coda_backend_netcdf) {
        cursor_local._4_4_ = coda_netcdf_cursor_get_array_dim(cursor,num_dims,dim);
      }
      else {
        if (cVar1 != coda_backend_grib) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                        ,0x8be,"int coda_cursor_get_array_dim(const coda_cursor *, int *, long *)");
        }
        cursor_local._4_4_ = coda_grib_cursor_get_array_dim(cursor,num_dims,dim);
      }
    }
    else {
      pcVar2 = coda_type_get_class_name(local_38->type_class);
      coda_set_error(-0x69,"cursor does not refer to an array (current type is %s)",pcVar2);
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_get_array_dim(const coda_cursor *cursor, int *num_dims, long dim[])
{
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (num_dims == NULL || dim == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dimension argument(s) are NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
        case coda_backend_binary:
            return coda_ascbin_cursor_get_array_dim(cursor, num_dims, dim);
        case coda_backend_memory:
            return coda_mem_cursor_get_array_dim(cursor, num_dims, dim);
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            return coda_hdf4_cursor_get_array_dim(cursor, num_dims, dim);
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            return coda_hdf5_cursor_get_array_dim(cursor, num_dims, dim);
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            return coda_cdf_cursor_get_array_dim(cursor, num_dims, dim);
        case coda_backend_netcdf:
            return coda_netcdf_cursor_get_array_dim(cursor, num_dims, dim);
        case coda_backend_grib:
            return coda_grib_cursor_get_array_dim(cursor, num_dims, dim);
    }

    assert(0);
    exit(1);
}